

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O0

void __thiscall
iDynTree::DiscreteExtendedKalmanFilterHelper::DiscreteExtendedKalmanFilterHelper
          (DiscreteExtendedKalmanFilterHelper *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR___cxa_pure_virtual_006f5a58;
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 4));
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 8));
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0xc));
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0x10));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x14));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x19));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x1e));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x23));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x28));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x2d));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x32));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x37));
  *(undefined1 *)(in_RDI + 0x3c) = 0;
  *(undefined1 *)((long)in_RDI + 0x1e1) = 0;
  *(undefined1 *)((long)in_RDI + 0x1e2) = 0;
  *(undefined1 *)((long)in_RDI + 0x1e3) = 0;
  *(undefined1 *)((long)in_RDI + 0x1e4) = 0;
  return;
}

Assistant:

iDynTree::DiscreteExtendedKalmanFilterHelper::DiscreteExtendedKalmanFilterHelper()
{

}